

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> scale_requant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  void *pvVar20;
  int iVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  int u;
  int _w;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  uint _h;
  int _c;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  int n_1;
  void *pvVar39;
  ulong uVar40;
  void *pvVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 *puVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  ulong uVar54;
  undefined1 *puVar55;
  long lVar56;
  char *pcVar57;
  undefined1 *puVar58;
  void *pvVar59;
  undefined1 *puVar60;
  int i;
  uint uVar61;
  long lVar62;
  float fVar63;
  float fVar64;
  long local_238;
  int sum0 [4];
  Mat kernel_tm;
  Mat bottom_tm;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  Mat bottom_im2row;
  
  iVar47 = bottom_blob->c;
  iVar45 = top_blob->w;
  iVar46 = top_blob->h;
  pvVar41 = _kernel->data;
  pvVar20 = _bias->data;
  _w = iVar47 * kernel_h * kernel_w;
  _h = iVar46 * iVar45;
  iVar51 = bottom_blob->w;
  iVar28 = top_blob->c;
  uVar34 = (ulong)iVar28;
  Mat::Mat(&bottom_im2row,_w,_h,1,
           *(Allocator **)
            (scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  pvVar59 = bottom_im2row.data;
  uVar43 = 0;
  if (0 < kernel_w) {
    uVar43 = (ulong)(uint)kernel_w;
  }
  iVar48 = 0;
  if (0 < kernel_h) {
    iVar48 = kernel_h;
  }
  iVar25 = 0;
  if (0 < iVar47) {
    iVar25 = iVar47;
  }
  if (iVar45 < 1) {
    iVar45 = 0;
  }
  iVar21 = 0;
  if (iVar46 < 1) {
    iVar46 = 0;
  }
  iVar53 = 0;
  for (iVar33 = 0; iVar33 != iVar46; iVar33 = iVar33 + 1) {
    iVar26 = iVar21;
    for (iVar32 = 0; iVar32 != iVar45; iVar32 = iVar32 + 1) {
      for (_c = 0; _c != iVar25; _c = _c + 1) {
        Mat::channel(&bottom_tm,bottom_blob,_c);
        pvVar39 = bottom_tm.data;
        Mat::~Mat(&bottom_tm);
        iVar31 = iVar26;
        for (iVar27 = 0; iVar27 != iVar48; iVar27 = iVar27 + 1) {
          for (uVar49 = 0; uVar43 != uVar49; uVar49 = uVar49 + 1) {
            *(undefined1 *)((long)pvVar59 + uVar49 + (long)iVar53) =
                 *(undefined1 *)((long)pvVar39 + (long)(iVar31 + (int)uVar49));
          }
          iVar53 = iVar53 + (int)uVar49;
          iVar31 = iVar31 + iVar51;
        }
      }
      iVar26 = iVar26 + stride_w;
    }
    iVar21 = iVar21 + stride_h * iVar51;
  }
  iVar45 = kernel_h * kernel_w * 4;
  Mat::Mat(&bottom_tm,iVar45,iVar47,((int)_h / 4) * -3 + _h,1,
           *(Allocator **)
            (scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  local_238 = 1;
  uVar49 = 0;
  uVar43 = (ulong)(uint)((int)_h >> 2);
  if ((int)_h >> 2 < 1) {
    uVar43 = uVar49;
  }
  lVar52 = 3;
  lVar56 = 2;
  for (uVar54 = 0; sVar24 = bottom_im2row.elemsize, pvVar39 = bottom_im2row.data,
      sVar23 = bottom_tm.cstep, sVar22 = bottom_tm.elemsize, pvVar59 = bottom_tm.data,
      uVar54 != uVar43; uVar54 = uVar54 + 1) {
    lVar29 = (long)bottom_im2row.w;
    kernel_tm.data = (void *)(bottom_tm.cstep * uVar54 * bottom_tm.elemsize + (long)bottom_tm.data);
    kernel_tm.refcount = (int *)0x0;
    kernel_tm.elemsize = bottom_tm.elemsize;
    kernel_tm.packing = bottom_tm.packing;
    kernel_tm.allocator = bottom_tm.allocator;
    kernel_tm.dims = 2;
    kernel_tm.w = bottom_tm.w;
    kernel_tm.h = bottom_tm.h;
    kernel_tm.c = 1;
    kernel_tm.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    Mat::~Mat(&kernel_tm);
    lVar62 = sVar23 * sVar22 * uVar54;
    lVar30 = sVar24 * lVar52 * lVar29;
    lVar35 = sVar24 * lVar56 * lVar29;
    lVar36 = sVar24 * local_238 * lVar29;
    lVar29 = sVar24 * uVar49 * lVar29;
    for (lVar50 = 0; (int)lVar50 + 1 < _w; lVar50 = lVar50 + 2) {
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar29);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 1) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar29 + 1);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 2) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar36);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 3) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar36 + 1);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 4) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar35);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 5) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar35 + 1);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 6) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar30);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 7) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar30 + 1);
    }
    for (; (int)lVar50 < _w; lVar50 = lVar50 + 1) {
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar29);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 1) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar36);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 2) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar35);
      *(undefined1 *)((long)pvVar59 + lVar50 * 4 + lVar62 + 3) =
           *(undefined1 *)((long)pvVar39 + lVar50 + lVar30);
    }
    lVar52 = lVar52 + 4;
    lVar56 = lVar56 + 4;
    local_238 = local_238 + 4;
    uVar49 = uVar49 + 4;
  }
  for (uVar61 = _h & 0xfffffffc; iVar46 = bottom_im2row.w, sVar22 = bottom_im2row.elemsize,
      pvVar59 = bottom_im2row.data, (int)uVar61 < (int)_h; uVar61 = uVar61 + 1) {
    pvVar39 = (void *)((long)((int)uVar61 % 4 + (int)uVar61 / 4) * bottom_tm.cstep *
                       bottom_tm.elemsize + (long)bottom_tm.data);
    kernel_tm.refcount = (int *)0x0;
    kernel_tm.elemsize = bottom_tm.elemsize;
    kernel_tm.packing = bottom_tm.packing;
    kernel_tm.allocator = bottom_tm.allocator;
    kernel_tm.dims = 2;
    kernel_tm.w = bottom_tm.w;
    kernel_tm.h = bottom_tm.h;
    kernel_tm.c = 1;
    kernel_tm.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    kernel_tm.data = pvVar39;
    Mat::~Mat(&kernel_tm);
    lVar52 = (long)(int)(iVar46 * uVar61) * sVar22;
    for (lVar56 = 0; (int)lVar56 + 1 < _w; lVar56 = lVar56 + 2) {
      *(undefined1 *)((long)pvVar39 + lVar56) = *(undefined1 *)((long)pvVar59 + lVar56 + lVar52);
      *(undefined1 *)((long)pvVar39 + lVar56 + 1) =
           *(undefined1 *)((long)pvVar59 + lVar56 + lVar52 + 1);
    }
    for (; (int)lVar56 < _w; lVar56 = lVar56 + 1) {
      *(undefined1 *)((long)pvVar39 + lVar56) = *(undefined1 *)((long)pvVar59 + lVar56 + lVar52);
    }
  }
  Mat::Mat(&kernel_tm,iVar45,iVar47,iVar28 % 4 + iVar28 / 4,1,
           *(Allocator **)
            (scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  uVar49 = 0;
  uVar43 = (ulong)(uint)(iVar28 >> 2);
  if (iVar28 >> 2 < 1) {
    uVar43 = uVar49;
  }
  iVar28 = iVar47 * kernel_h * kernel_w;
  iVar45 = iVar28 * 4;
  iVar46 = iVar28 * 3;
  iVar28 = iVar28 * 2;
  iVar51 = _w;
  for (uVar54 = 0; sVar23 = kernel_tm.cstep, sVar22 = kernel_tm.elemsize, pvVar59 = kernel_tm.data,
      uVar54 != uVar43; uVar54 = uVar54 + 1) {
    iVar48 = (int)uVar49;
    sum0._0_8_ = kernel_tm.cstep * uVar54 * kernel_tm.elemsize + (long)kernel_tm.data;
    sum0[2] = 0;
    sum0[3] = 0;
    Mat::~Mat((Mat *)sum0);
    lVar56 = sVar23 * sVar22 * uVar54;
    for (lVar52 = 0; (int)lVar52 + 1 < _w; lVar52 = lVar52 + 2) {
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar48);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 1) =
           *(undefined1 *)((long)pvVar41 + lVar52 + (long)iVar48 + 1);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 2) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar51);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 3) =
           *(undefined1 *)((long)pvVar41 + lVar52 + (long)iVar51 + 1);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 4) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar28);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 5) =
           *(undefined1 *)((long)pvVar41 + lVar52 + (long)iVar28 + 1);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 6) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar46);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 7) =
           *(undefined1 *)((long)pvVar41 + lVar52 + (long)iVar46 + 1);
    }
    for (; (int)lVar52 < _w; lVar52 = lVar52 + 1) {
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar48);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 1) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar51);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 2) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar28);
      *(undefined1 *)((long)pvVar59 + lVar52 * 4 + lVar56 + 3) =
           *(undefined1 *)((long)pvVar41 + lVar52 + iVar46);
    }
    uVar49 = (ulong)(uint)(iVar48 + iVar45);
    iVar51 = iVar51 + iVar45;
    iVar28 = iVar28 + iVar45;
    iVar46 = iVar46 + iVar45;
  }
  iVar47 = iVar47 * kernel_h * kernel_w * ((uint)(uVar34 >> 2) & 0x3fffffff) * 4;
  uVar54 = uVar34 & 0xfffffffffffffffc;
  for (uVar49 = uVar54; (long)uVar49 < (long)uVar34; uVar49 = uVar49 + 1) {
    uVar42 = (ulong)(uint)((int)uVar49 >> 0x1f) << 0x20 | uVar49 & 0xffffffff;
    pvVar59 = (void *)((long)((int)((long)uVar42 % 4) + (int)((long)uVar42 / 4)) * kernel_tm.cstep *
                       kernel_tm.elemsize + (long)kernel_tm.data);
    sum0[2] = 0;
    sum0[3] = 0;
    sum0._0_8_ = pvVar59;
    Mat::~Mat((Mat *)sum0);
    for (lVar52 = 0; (int)lVar52 + 1 < _w; lVar52 = lVar52 + 2) {
      *(undefined1 *)((long)pvVar59 + lVar52) = *(undefined1 *)((long)pvVar41 + lVar52 + iVar47);
      *(undefined1 *)((long)pvVar59 + lVar52 + 1) =
           *(undefined1 *)((long)pvVar41 + lVar52 + (long)iVar47 + 1);
    }
    for (; (int)lVar52 < _w; lVar52 = lVar52 + 1) {
      *(undefined1 *)((long)pvVar59 + lVar52) = *(undefined1 *)((long)pvVar41 + lVar52 + iVar47);
    }
    iVar47 = iVar47 + _w;
  }
  for (uVar49 = 0; uVar49 != uVar43; uVar49 = uVar49 + 1) {
    uVar42 = uVar49 * 4;
    Mat::channel((Mat *)sum0,top_blob,(uint)uVar42);
    puVar55 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    uVar37 = uVar42 | 1;
    Mat::channel((Mat *)sum0,top_blob,(int)uVar37);
    puVar44 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    uVar38 = uVar42 | 2;
    Mat::channel((Mat *)sum0,top_blob,(int)uVar38);
    puVar58 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    uVar40 = uVar42 | 3;
    Mat::channel((Mat *)sum0,top_blob,(uint)uVar42 | 3);
    puVar60 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    if (pvVar20 == (void *)0x0) {
      fVar3 = 0.0;
      fVar1 = 0.0;
      fVar2 = 0.0;
      fVar64 = 0.0;
    }
    else {
      fVar1 = *(float *)((long)pvVar20 + uVar49 * 0x10);
      fVar2 = *(float *)((long)pvVar20 + uVar37 * 4);
      fVar3 = *(float *)((long)pvVar20 + uVar38 * 4);
      fVar64 = *(float *)((long)pvVar20 + uVar40 * 4);
    }
    lVar52 = *(long *)scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
    fVar4 = *(float *)(lVar52 + uVar49 * 0x20);
    fVar5 = *(float *)(lVar52 + 4 + uVar49 * 0x20);
    fVar6 = *(float *)(lVar52 + uVar37 * 8);
    fVar7 = *(float *)(lVar52 + 4 + uVar37 * 8);
    fVar8 = *(float *)(lVar52 + uVar38 * 8);
    fVar9 = *(float *)(lVar52 + 4 + uVar38 * 8);
    fVar10 = *(float *)(lVar52 + uVar40 * 8);
    fVar11 = *(float *)(lVar52 + 4 + uVar40 * 8);
    for (uVar42 = 0; (long)(uVar42 | 3) < (long)(int)_h; uVar42 = uVar42 + 4) {
      pvVar41 = (void *)((uVar42 >> 2) * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data
                        );
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pvVar41;
      Mat::~Mat((Mat *)sum0);
      pcVar57 = (char *)(kernel_tm.cstep * uVar49 * kernel_tm.elemsize + (long)kernel_tm.data);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar57;
      Mat::~Mat((Mat *)sum0);
      sum0[0] = 0;
      sum0[1] = 0;
      sum0[2] = 0;
      sum0[3] = 0;
      sum1[0] = 0;
      sum1[1] = 0;
      sum1[2] = 0;
      sum1[3] = 0;
      sum2[0] = 0;
      sum2[1] = 0;
      sum2[2] = 0;
      sum2[3] = 0;
      sum3[0] = 0;
      sum3[1] = 0;
      sum3[2] = 0;
      sum3[3] = 0;
      for (uVar61 = 0; (int)(uVar61 | 1) < _w; uVar61 = uVar61 + 2) {
        cVar12 = *pcVar57;
        cVar13 = pcVar57[1];
        cVar14 = pcVar57[2];
        cVar15 = pcVar57[3];
        cVar16 = pcVar57[4];
        cVar17 = pcVar57[5];
        cVar18 = pcVar57[6];
        cVar19 = pcVar57[7];
        for (lVar52 = 0; lVar52 != 8; lVar52 = lVar52 + 2) {
          iVar45 = (int)*(char *)((long)pvVar41 + lVar52);
          iVar47 = (int)*(char *)((long)pvVar41 + lVar52 + 1);
          *(int *)((long)sum0 + lVar52 * 2) =
               iVar47 * cVar13 + iVar45 * cVar12 + *(int *)((long)sum0 + lVar52 * 2);
          *(int *)((long)sum1 + lVar52 * 2) =
               cVar15 * iVar47 + cVar14 * iVar45 + *(int *)((long)sum1 + lVar52 * 2);
          *(int *)((long)sum2 + lVar52 * 2) =
               cVar17 * iVar47 + cVar16 * iVar45 + *(int *)((long)sum2 + lVar52 * 2);
          *(int *)((long)sum3 + lVar52 * 2) =
               iVar47 * cVar19 + iVar45 * cVar18 + *(int *)((long)sum3 + lVar52 * 2);
        }
        pcVar57 = pcVar57 + 8;
        pvVar41 = (void *)((long)pvVar41 + 8);
      }
      for (; (int)uVar61 < _w; uVar61 = uVar61 + 1) {
        cVar12 = *pcVar57;
        cVar13 = pcVar57[1];
        cVar14 = pcVar57[2];
        cVar15 = pcVar57[3];
        for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
          iVar47 = (int)*(char *)((long)pvVar41 + lVar52);
          sum0[lVar52] = sum0[lVar52] + iVar47 * cVar12;
          sum1[lVar52] = sum1[lVar52] + cVar13 * iVar47;
          sum2[lVar52] = sum2[lVar52] + cVar14 * iVar47;
          sum3[lVar52] = sum3[lVar52] + iVar47 * cVar15;
        }
        pcVar57 = pcVar57 + 4;
        pvVar41 = (void *)((long)pvVar41 + 4);
      }
      for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
        fVar63 = roundf(((float)sum0[lVar52] * fVar4 + fVar1) * fVar5);
        if (fVar63 <= -128.0) {
          fVar63 = -128.0;
        }
        if (127.0 <= fVar63) {
          fVar63 = 127.0;
        }
        puVar55[lVar52] = (char)(int)fVar63;
        fVar63 = roundf(((float)sum1[lVar52] * fVar6 + fVar2) * fVar7);
        if (fVar63 <= -128.0) {
          fVar63 = -128.0;
        }
        if (127.0 <= fVar63) {
          fVar63 = 127.0;
        }
        puVar44[lVar52] = (char)(int)fVar63;
        fVar63 = roundf(((float)sum2[lVar52] * fVar8 + fVar3) * fVar9);
        if (fVar63 <= -128.0) {
          fVar63 = -128.0;
        }
        if (127.0 <= fVar63) {
          fVar63 = 127.0;
        }
        puVar58[lVar52] = (char)(int)fVar63;
        fVar63 = roundf(((float)sum3[lVar52] * fVar10 + fVar64) * fVar11);
        if (fVar63 <= -128.0) {
          fVar63 = -128.0;
        }
        if (127.0 <= fVar63) {
          fVar63 = 127.0;
        }
        puVar60[lVar52] = (char)(int)fVar63;
      }
      puVar55 = puVar55 + 4;
      puVar44 = puVar44 + 4;
      puVar58 = puVar58 + 4;
      puVar60 = puVar60 + 4;
    }
    while (pvVar41 = bottom_tm.data, uVar61 = (uint)uVar42, (int)uVar61 < (int)_h) {
      uVar42 = (ulong)((uVar61 & 3) + ((uint)(uVar42 >> 2) & 0x3fffffff));
      lVar56 = bottom_tm.cstep * bottom_tm.elemsize;
      sum0._0_8_ = uVar42 * lVar56 + (long)bottom_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      pvVar59 = kernel_tm.data;
      lVar29 = kernel_tm.cstep * uVar49 * kernel_tm.elemsize;
      pcVar57 = (char *)((long)kernel_tm.data + lVar29);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar57;
      Mat::~Mat((Mat *)sum0);
      lVar56 = lVar56 * uVar42;
      iVar47 = 0;
      iVar45 = 0;
      iVar51 = 0;
      iVar46 = 0;
      for (lVar52 = 0; (int)lVar52 + 1 < _w; lVar52 = lVar52 + 2) {
        iVar28 = (int)*(char *)((long)pvVar41 + lVar52 + lVar56);
        iVar48 = (int)*(char *)((long)pvVar41 + lVar52 + lVar56 + 1);
        iVar47 = pcVar57[1] * iVar48 + *pcVar57 * iVar28 + iVar47;
        iVar45 = pcVar57[3] * iVar48 + pcVar57[2] * iVar28 + iVar45;
        iVar51 = pcVar57[5] * iVar48 + pcVar57[4] * iVar28 + iVar51;
        iVar46 = pcVar57[7] * iVar48 + pcVar57[6] * iVar28 + iVar46;
        pcVar57 = pcVar57 + 8;
      }
      for (; (int)lVar52 < _w; lVar52 = lVar52 + 1) {
        iVar28 = (int)*(char *)((long)pvVar41 + lVar52 + lVar56);
        iVar47 = iVar47 + *(char *)((long)pvVar59 + lVar52 * 4 + lVar29) * iVar28;
        iVar45 = iVar45 + *(char *)((long)pvVar59 + lVar52 * 4 + lVar29 + 1) * iVar28;
        iVar51 = iVar51 + *(char *)((long)pvVar59 + lVar52 * 4 + lVar29 + 2) * iVar28;
        iVar46 = iVar46 + *(char *)((long)pvVar59 + lVar52 * 4 + lVar29 + 3) * iVar28;
      }
      fVar63 = roundf(((float)iVar47 * fVar4 + fVar1) * fVar5);
      if (fVar63 <= -128.0) {
        fVar63 = -128.0;
      }
      if (127.0 <= fVar63) {
        fVar63 = 127.0;
      }
      *puVar55 = (char)(int)fVar63;
      fVar63 = roundf(((float)iVar45 * fVar6 + fVar2) * fVar7);
      if (fVar63 <= -128.0) {
        fVar63 = -128.0;
      }
      if (127.0 <= fVar63) {
        fVar63 = 127.0;
      }
      *puVar44 = (char)(int)fVar63;
      fVar63 = roundf(((float)iVar51 * fVar8 + fVar3) * fVar9);
      if (fVar63 <= -128.0) {
        fVar63 = -128.0;
      }
      if (127.0 <= fVar63) {
        fVar63 = 127.0;
      }
      *puVar58 = (char)(int)fVar63;
      fVar63 = roundf(((float)iVar46 * fVar10 + fVar64) * fVar11);
      if (fVar63 <= -128.0) {
        fVar63 = -128.0;
      }
      if (127.0 <= fVar63) {
        fVar63 = 127.0;
      }
      *puVar60 = (char)(int)fVar63;
      puVar55 = puVar55 + 1;
      puVar44 = puVar44 + 1;
      puVar58 = puVar58 + 1;
      puVar60 = puVar60 + 1;
      uVar42 = (ulong)(uVar61 + 1);
    }
  }
  iVar47 = 0;
  if (0 < _w) {
    iVar47 = _w;
  }
  for (; (long)uVar54 < (long)uVar34; uVar54 = uVar54 + 1) {
    iVar45 = (int)uVar54;
    Mat::channel((Mat *)sum0,top_blob,iVar45);
    puVar55 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    if (pvVar20 == (void *)0x0) {
      fVar1 = 0.0;
    }
    else {
      fVar1 = *(float *)((long)pvVar20 + uVar54 * 4);
    }
    fVar2 = *(float *)(*(long *)scale_requant.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar54 * 8);
    fVar3 = *(float *)(*(long *)scale_requant.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4 + uVar54 * 8);
    iVar46 = (int)((long)((ulong)(uint)(iVar45 >> 0x1f) << 0x20 | uVar54 & 0xffffffff) / 4);
    lVar52 = (long)(iVar46 * -3 + iVar45);
    for (uVar43 = 0; (long)(uVar43 | 3) < (long)(int)_h; uVar43 = uVar43 + 4) {
      pvVar41 = (void *)((uVar43 >> 2) * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data
                        );
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pvVar41;
      Mat::~Mat((Mat *)sum0);
      pcVar57 = (char *)(kernel_tm.cstep * lVar52 * kernel_tm.elemsize + (long)kernel_tm.data);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar57;
      Mat::~Mat((Mat *)sum0);
      sum0[0] = 0;
      sum0[1] = 0;
      sum0[2] = 0;
      sum0[3] = 0;
      for (uVar61 = 0; (int)(uVar61 | 1) < _w; uVar61 = uVar61 + 2) {
        cVar12 = *pcVar57;
        cVar13 = pcVar57[1];
        for (lVar56 = 0; lVar56 != 4; lVar56 = lVar56 + 1) {
          sum0[lVar56] = (int)*(char *)((long)pvVar41 + lVar56 * 2 + 1) * (int)cVar13 +
                         (int)*(char *)((long)pvVar41 + lVar56 * 2) * (int)cVar12 + sum0[lVar56];
        }
        pcVar57 = pcVar57 + 2;
        pvVar41 = (void *)((long)pvVar41 + 8);
      }
      for (; (int)uVar61 < _w; uVar61 = uVar61 + 1) {
        cVar12 = *pcVar57;
        for (lVar56 = 0; lVar56 != 4; lVar56 = lVar56 + 1) {
          sum0[lVar56] = sum0[lVar56] + (int)*(char *)((long)pvVar41 + lVar56) * (int)cVar12;
        }
        pcVar57 = pcVar57 + 1;
        pvVar41 = (void *)((long)pvVar41 + 4);
      }
      for (lVar56 = 0; lVar56 != 4; lVar56 = lVar56 + 1) {
        fVar64 = roundf(((float)sum0[lVar56] * fVar2 + fVar1) * fVar3);
        if (fVar64 <= -128.0) {
          fVar64 = -128.0;
        }
        if (127.0 <= fVar64) {
          fVar64 = 127.0;
        }
        puVar55[lVar56] = (char)(int)fVar64;
      }
      puVar55 = puVar55 + 4;
    }
    while (pvVar41 = bottom_tm.data, uVar61 = (uint)uVar43, (int)uVar61 < (int)_h) {
      uVar43 = (ulong)((uVar61 & 3) + ((uint)(uVar43 >> 2) & 0x3fffffff));
      lVar29 = bottom_tm.cstep * bottom_tm.elemsize;
      sum0._0_8_ = uVar43 * lVar29 + (long)bottom_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      sVar23 = kernel_tm.cstep;
      sVar22 = kernel_tm.elemsize;
      pvVar59 = kernel_tm.data;
      sum0._0_8_ = kernel_tm.cstep * lVar52 * kernel_tm.elemsize + (long)kernel_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      iVar51 = 0;
      for (lVar56 = 0; iVar47 != (int)lVar56; lVar56 = lVar56 + 1) {
        iVar51 = iVar51 + (int)*(char *)((long)pvVar41 + lVar56 + lVar29 * uVar43) *
                          (int)*(char *)((long)pvVar59 +
                                        lVar56 + sVar23 * (long)(iVar45 + iVar46 * -3) * sVar22);
      }
      fVar64 = roundf(((float)iVar51 * fVar2 + fVar1) * fVar3);
      if (fVar64 <= -128.0) {
        fVar64 = -128.0;
      }
      if (127.0 <= fVar64) {
        fVar64 = 127.0;
      }
      *puVar55 = (char)(int)fVar64;
      puVar55 = puVar55 + 1;
      uVar43 = (ulong)(uVar61 + 1);
    }
  }
  Mat::~Mat(&kernel_tm);
  Mat::~Mat(&bottom_tm);
  Mat::~Mat(&bottom_im2row);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}